

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

int luaO_utf8esc(char *buff,unsigned_long x)

{
  int iVar1;
  uint local_20;
  int local_1c;
  uint mfb;
  int n;
  unsigned_long x_local;
  char *buff_local;
  
  local_1c = 1;
  if (x < 0x80000000) {
    if (x < 0x80) {
      buff[7] = (char)x;
    }
    else {
      local_20 = 0x3f;
      _mfb = x;
      do {
        iVar1 = local_1c + 1;
        buff[8 - local_1c] = (byte)_mfb & 0x3f | 0x80;
        _mfb = _mfb >> 6;
        local_20 = local_20 >> 1;
        local_1c = iVar1;
      } while (local_20 < _mfb);
      buff[8 - iVar1] = (byte)((local_20 ^ 0xffffffff) << 1) | (byte)_mfb;
    }
    return local_1c;
  }
  __assert_fail("x <= 0x7FFFFFFFu",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                ,0x15e,"int luaO_utf8esc(char *, unsigned long)");
}

Assistant:

int luaO_utf8esc (char *buff, unsigned long x) {
  int n = 1;  /* number of bytes put in buffer (backwards) */
  lua_assert(x <= 0x7FFFFFFFu);
  if (x < 0x80)  /* ascii? */
    buff[UTF8BUFFSZ - 1] = cast_char(x);
  else {  /* need continuation bytes */
    unsigned int mfb = 0x3f;  /* maximum that fits in first byte */
    do {  /* add continuation bytes */
      buff[UTF8BUFFSZ - (n++)] = cast_char(0x80 | (x & 0x3f));
      x >>= 6;  /* remove added bits */
      mfb >>= 1;  /* now there is one less bit available in first byte */
    } while (x > mfb);  /* still needs continuation byte? */
    buff[UTF8BUFFSZ - n] = cast_char((~mfb << 1) | x);  /* add first byte */
  }
  return n;
}